

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O3

int32 get_rc_nssid(dict2pid_t *d2p,s3wid_t w)

{
  short sVar1;
  dictword_t *pdVar2;
  s3cipid_t *psVar3;
  xwdssid_t *pxVar4;
  long lVar5;
  
  pdVar2 = d2p->dict->word;
  lVar5 = (long)pdVar2[w].pronlen;
  psVar3 = pdVar2[w].ciphone;
  sVar1 = psVar3[lVar5 + -1];
  if (lVar5 == 1) {
    pxVar4 = d2p->lrssid[sVar1];
  }
  else {
    pxVar4 = d2p->rssid[sVar1] + psVar3[lVar5 + -2];
  }
  return pxVar4->n_ssid;
}

Assistant:

int32
get_rc_nssid(dict2pid_t * d2p, s3wid_t w)
{
    int32 pronlen;
    s3cipid_t b, lc;
    dict_t *dict = d2p->dict;

    pronlen = dict->word[w].pronlen;
    b = dict->word[w].ciphone[pronlen - 1];

    if (pronlen == 1) {
        /* Is this true ?
           No known left context.  But all cimaps (for any l) are identical; pick one 
        */
        /*E_INFO("Single phone word\n"); */
        return (d2p->lrssid[b][0].n_ssid);
    }
    else {
        /*    E_INFO("Multiple phone word\n"); */
        lc = dict->word[w].ciphone[pronlen - 2];
        return (d2p->rssid[b][lc].n_ssid);
    }

}